

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O1

LPColSetBase<double> * __thiscall
soplex::LPColSetBase<double>::operator=(LPColSetBase<double> *this,LPColSetBase<double> *rs)

{
  if (this != rs) {
    SVSetBase<double>::operator=(&this->super_SVSetBase<double>,&rs->super_SVSetBase<double>);
    VectorBase<double>::operator=(&this->low,&rs->low);
    VectorBase<double>::operator=(&this->up,&rs->up);
    VectorBase<double>::operator=(&this->object,&rs->object);
    DataArray<int>::reSize(&this->scaleExp,(rs->scaleExp).thesize);
    memcpy((this->scaleExp).data,(rs->scaleExp).data,(ulong)(uint)(this->scaleExp).thesize << 2);
  }
  return this;
}

Assistant:

LPColSetBase<R>& operator=(const LPColSetBase<R>& rs)
   {
      if(this != &rs)
      {
         SVSetBase<R>::operator=(rs);
         low = rs.low;
         up = rs.up;
         object = rs.object;
         scaleExp = rs.scaleExp;

         assert(isConsistent());
      }

      return *this;
   }